

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_rwkv_wkv6_f32(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  void *__s;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  undefined1 auVar19 [16];
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined1 (*pauVar27) [64];
  undefined8 *puVar28;
  long in_RSI;
  int *in_RDI;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  float temp_val;
  float prev_state_val;
  float kv_val;
  float v_val;
  size_t h_2d_i_j_offset_1;
  size_t t_h_j_offset_1;
  int64_t j_1;
  __m512 new_state_vec;
  __m512 temp_vec;
  __m512 kv_vec;
  __m512 dst_vec;
  __m512 prev_state_vec;
  __m512 v_vec;
  size_t h_2d_i_j_offset;
  size_t t_h_j_offset;
  size_t base_j;
  int64_t j;
  __m512 time_decay_vec;
  __m512 time_faaaa_vec;
  __m512 r_vec;
  __m512 k_vec;
  float time_decay_val;
  float time_faaaa_val;
  float r_val;
  float k_val;
  size_t h_2d_i_offset;
  size_t h_i_offset;
  size_t t_h_i_offset;
  int64_t i;
  size_t h_2d_offset;
  size_t t_h_offset;
  size_t h_offset;
  int64_t h;
  float *state_prev;
  float *state_cur;
  size_t state_offset;
  size_t t_offset;
  int64_t t;
  int64_t vec_count;
  size_t h_stride_2d;
  size_t h_stride;
  size_t t_stride;
  float *time_decay;
  float *time_faaaa;
  float *r;
  float *v;
  float *k;
  int h_end;
  int h_start;
  int nth;
  int ith;
  float *state;
  float *dst_data;
  int64_t head_size;
  int64_t n_seqs;
  int64_t HEADS;
  int64_t C;
  int64_t T;
  ggml_threadpool *in_stack_fffffffffffff568;
  long local_a90;
  long local_a70;
  long local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  long local_888;
  long local_730;
  long local_710;
  long local_6e8;
  
  lVar8 = *(long *)(*(long *)(in_RSI + 0xa0) + 0x20);
  lVar9 = *(long *)(in_RSI + 0x10);
  lVar10 = *(long *)(*(long *)(in_RSI + 0xa0) + 0x18);
  lVar11 = *(long *)(*(long *)(in_RSI + 0xc0) + 0x18);
  lVar20 = lVar9 / lVar10;
  __s = *(void **)(in_RSI + 0xf8);
  lVar12 = *(long *)(in_RSI + 0xf8);
  iVar6 = *in_RDI;
  iVar7 = in_RDI[1];
  if (iVar6 < lVar10) {
    local_a70 = lVar10;
    if ((lVar10 * (iVar6 + 1)) / (long)iVar7 < lVar10) {
      local_a70 = (lVar10 * (iVar6 + 1)) / (long)iVar7;
    }
    lVar13 = *(long *)(*(long *)(in_RSI + 0x98) + 0xf8);
    lVar14 = *(long *)(*(long *)(in_RSI + 0xa0) + 0xf8);
    lVar15 = *(long *)(*(long *)(in_RSI + 0xa8) + 0xf8);
    lVar16 = *(long *)(*(long *)(in_RSI + 0xb0) + 0xf8);
    lVar17 = *(long *)(*(long *)(in_RSI + 0xb8) + 0xf8);
    if (lVar9 % lVar10 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1f12,"GGML_ASSERT(%s) failed","C % HEADS == 0");
    }
    if (iVar6 == 0) {
      memset(__s,0,lVar8 * lVar9 * 4);
    }
    ggml_barrier(in_stack_fffffffffffff568);
    for (local_6e8 = 0; local_6e8 < lVar8; local_6e8 = local_6e8 + 1) {
      lVar21 = lVar20 * lVar9 * (local_6e8 / (lVar8 / lVar11));
      lVar22 = lVar12 + lVar9 * lVar8 * 4 + lVar21 * 4;
      local_a90 = lVar22;
      if (local_6e8 % (lVar8 / lVar11) == 0) {
        local_a90 = *(long *)(*(long *)(in_RSI + 0xc0) + 0xf8) + lVar21 * 4;
      }
      for (local_710 = (long)(int)((lVar10 * iVar6) / (long)iVar7); local_710 < (int)local_a70;
          local_710 = local_710 + 1) {
        lVar21 = local_710 * (lVar9 / lVar10);
        lVar23 = local_6e8 * lVar10 * lVar20 + lVar21;
        for (local_730 = 0; local_730 < lVar20; local_730 = local_730 + 1) {
          lVar24 = lVar23 + local_730;
          lVar25 = local_710 * lVar20 * lVar20 + local_730 * (lVar9 / lVar10);
          fVar1 = *(float *)(lVar13 + lVar24 * 4);
          uVar2 = *(uint *)(lVar15 + lVar24 * 4);
          uVar3 = *(uint *)(lVar16 + (lVar21 + local_730) * 4);
          uVar4 = *(uint *)(lVar17 + lVar24 * 4);
          auVar29 = vbroadcastss_avx512f(ZEXT416((uint)fVar1));
          auVar30 = vbroadcastss_avx512f(ZEXT416(uVar2));
          auVar31 = vbroadcastss_avx512f(ZEXT416(uVar3));
          auVar32 = vbroadcastss_avx512f(ZEXT416(uVar4));
          for (local_888 = 0; local_888 < lVar20 / 0x10; local_888 = local_888 + 1) {
            lVar24 = lVar23 + local_888 * 0x10;
            lVar26 = lVar25 + local_888 * 0x10;
            pauVar27 = (undefined1 (*) [64])(local_a90 + lVar26 * 4);
            auVar35 = *pauVar27;
            auVar33 = vmulps_avx512f(*(undefined1 (*) [64])(lVar14 + lVar24 * 4),auVar29);
            auVar34 = vfmadd213ps_avx512f(auVar31,auVar33,*pauVar27);
            auVar34 = vfmadd213ps_avx512f(auVar30,auVar34,
                                          *(undefined1 (*) [64])((long)__s + lVar24 * 4));
            puVar28 = (undefined8 *)((long)__s + lVar24 * 4);
            local_980 = auVar34._0_8_;
            uStack_978 = auVar34._8_8_;
            uStack_970 = auVar34._16_8_;
            uStack_968 = auVar34._24_8_;
            uStack_960 = auVar34._32_8_;
            uStack_958 = auVar34._40_8_;
            uStack_950 = auVar34._48_8_;
            uStack_948 = auVar34._56_8_;
            *puVar28 = local_980;
            puVar28[1] = uStack_978;
            puVar28[2] = uStack_970;
            puVar28[3] = uStack_968;
            puVar28[4] = uStack_960;
            puVar28[5] = uStack_958;
            puVar28[6] = uStack_950;
            puVar28[7] = uStack_948;
            auVar35 = vfmadd213ps_avx512f(auVar32,auVar35,auVar33);
            puVar28 = (undefined8 *)(lVar22 + lVar26 * 4);
            local_a40 = auVar35._0_8_;
            uStack_a38 = auVar35._8_8_;
            uStack_a30 = auVar35._16_8_;
            uStack_a28 = auVar35._24_8_;
            uStack_a20 = auVar35._32_8_;
            uStack_a18 = auVar35._40_8_;
            uStack_a10 = auVar35._48_8_;
            uStack_a08 = auVar35._56_8_;
            *puVar28 = local_a40;
            puVar28[1] = uStack_a38;
            puVar28[2] = uStack_a30;
            puVar28[3] = uStack_a28;
            puVar28[4] = uStack_a20;
            puVar28[5] = uStack_a18;
            puVar28[6] = uStack_a10;
            puVar28[7] = uStack_a08;
          }
          for (local_a48 = lVar20 / 0x10 << 4; local_a48 < lVar20; local_a48 = local_a48 + 1) {
            lVar24 = lVar23 + local_a48;
            lVar26 = lVar25 + local_a48;
            fVar18 = *(float *)(lVar14 + lVar24 * 4) * fVar1;
            uVar5 = *(uint *)(local_a90 + lVar26 * 4);
            auVar19 = vfmadd213ss_fma(ZEXT416(uVar3),ZEXT416((uint)fVar18),ZEXT416(uVar5));
            auVar19 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416(auVar19._0_4_),
                                      ZEXT416(*(uint *)((long)__s + lVar24 * 4)));
            *(int *)((long)__s + lVar24 * 4) = auVar19._0_4_;
            auVar19 = vfmadd213ss_fma(ZEXT416(uVar4),ZEXT416(uVar5),ZEXT416((uint)fVar18));
            *(int *)(lVar22 + lVar26 * 4) = auVar19._0_4_;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ggml_compute_forward_rwkv_wkv6_f32(
        const ggml_compute_params * params,
        ggml_tensor * dst) {
    const int64_t T = dst->src[1]->ne[2];
    const int64_t C = dst->ne[0];
    const int64_t HEADS = dst->src[1]->ne[1];
    const int64_t n_seqs = dst->src[5]->ne[1];
    const int64_t head_size = C / HEADS;

    float * dst_data = (float *) dst->data;
    float * state = ((float *) dst->data) + C * T;

    const int ith = params->ith;
    const int nth = params->nth;

    if (ith >= HEADS) {
        return;
    }

    const int h_start = (HEADS * ith) / nth;
    const int h_end = ((HEADS * (ith + 1)) / nth < HEADS) ?
                (HEADS * (ith + 1)) / nth : HEADS;

    float * k =          (float *) dst->src[0]->data;
    float * v =          (float *) dst->src[1]->data;
    float * r =          (float *) dst->src[2]->data;
    float * time_faaaa = (float *) dst->src[3]->data;
    float * time_decay = (float *) dst->src[4]->data;

    size_t t_stride = HEADS * head_size; // Same to C

    size_t h_stride = C / HEADS;
    GGML_ASSERT(C % HEADS == 0); // C must be divisible by HEADS
    size_t h_stride_2d = head_size * head_size;

    if (ith == 0) {
        memset(dst_data, 0, T * C * sizeof(float));
    }
    ggml_barrier(params->threadpool);


    #if defined(__AVX__) && !defined(__AVX512F__)
        #define GGML_F32X GGML_F32x8
        #define GGML_F32X_SET1 GGML_F32x8_SET1
        #define GGML_F32X_LOAD GGML_F32x8_LOAD
        #define GGML_F32X_STORE GGML_F32x8_STORE
        #define GGML_F32X_MUL GGML_F32x8_MUL
        #define GGML_F32X_FMA GGML_F32x8_FMA
        #define WKV_VECTOR_SIZE 8
    #elif defined(__AVX512F__)
        #define GGML_F32X GGML_F32x16
        #define GGML_F32X_SET1 GGML_F32x16_SET1
        #define GGML_F32X_LOAD GGML_F32x16_LOAD
        #define GGML_F32X_STORE GGML_F32x16_STORE
        #define GGML_F32X_MUL GGML_F32x16_MUL
        #define GGML_F32X_FMA GGML_F32x16_FMA
        #define WKV_VECTOR_SIZE 16
    #elif defined(__ARM_NEON) && defined(__aarch64__)
        #define GGML_F32X GGML_F32x4
        #define GGML_F32X_SET1 GGML_F32x4_SET1
        #define GGML_F32X_LOAD GGML_F32x4_LOAD
        #define GGML_F32X_STORE GGML_F32x4_STORE
        #define GGML_F32X_MUL GGML_F32x4_MUL
        #define GGML_F32X_FMA GGML_F32x4_FMA
        #define WKV_VECTOR_SIZE 4
    #endif

    #ifdef WKV_VECTOR_SIZE
        const int64_t vec_count = head_size / WKV_VECTOR_SIZE;

        for (int64_t t = 0; t < T; t++) {
            size_t t_offset = t * t_stride;
            size_t state_offset = head_size * C * (t / (T / n_seqs));
            float * state_cur = state + state_offset;
            float * state_prev = t % (T / n_seqs) ? state_cur : (float*)dst->src[5]->data + state_offset;

            for (int64_t h = h_start; h < h_end; h++) {
                size_t h_offset = h * h_stride;
                size_t t_h_offset = t_offset + h_offset;
                size_t h_2d_offset = h * h_stride_2d;

                for (int64_t i = 0; i < head_size; i++) {
                    size_t t_h_i_offset = t_h_offset + i;
                    size_t h_i_offset = h_offset + i;
                    size_t h_2d_i_offset = h_2d_offset + i * h_stride;

                    float k_val = k[t_h_i_offset];
                    float r_val = r[t_h_i_offset];
                    float time_faaaa_val = time_faaaa[h_i_offset];
                    float time_decay_val = time_decay[t_h_i_offset];

                    // Broadcast scalar values to vectors
                    GGML_F32X k_vec = GGML_F32X_SET1(k_val);
                    GGML_F32X r_vec = GGML_F32X_SET1(r_val);
                    GGML_F32X time_faaaa_vec = GGML_F32X_SET1(time_faaaa_val);
                    GGML_F32X time_decay_vec = GGML_F32X_SET1(time_decay_val);

                    for (int64_t j = 0; j < vec_count; j++) {
                        size_t base_j = j * WKV_VECTOR_SIZE;
                        size_t t_h_j_offset = t_h_offset + base_j;
                        size_t h_2d_i_j_offset = h_2d_i_offset + base_j;

                        // Load x elements at once
                        GGML_F32X v_vec = GGML_F32X_LOAD(&v[t_h_j_offset]);
                        GGML_F32X prev_state_vec = GGML_F32X_LOAD(&state_prev[h_2d_i_j_offset]);
                        GGML_F32X dst_vec = GGML_F32X_LOAD(&dst_data[t_h_j_offset]);

                        // Compute kv = v * k
                        GGML_F32X kv_vec = GGML_F32X_MUL(v_vec, k_vec);

                        // Compute temp = kv * time_faaaa + prev_state
                        GGML_F32X temp_vec = GGML_F32X_FMA(prev_state_vec, kv_vec, time_faaaa_vec);

                        // Update dst: dst += temp * r
                        dst_vec = GGML_F32X_FMA(dst_vec, temp_vec, r_vec);
                        GGML_F32X_STORE(&dst_data[t_h_j_offset], dst_vec);

                        // Update state: state = prev_state * time_decay + kv
                        GGML_F32X new_state_vec = GGML_F32X_FMA(kv_vec, prev_state_vec, time_decay_vec);
                        GGML_F32X_STORE(&state_cur[h_2d_i_j_offset], new_state_vec);
                    }

                    // Handle remaining elements, this will not be used.
                    for (int64_t j = vec_count * WKV_VECTOR_SIZE; j < head_size; j++) {
                        size_t t_h_j_offset = t_h_offset + j;
                        size_t h_2d_i_j_offset = h_2d_i_offset + j;
                        float v_val = v[t_h_j_offset];
                        float kv_val = v_val * k_val;
                        float prev_state_val = state_prev[h_2d_i_j_offset];
                        float temp_val = kv_val * time_faaaa_val + prev_state_val;
                        dst_data[t_h_j_offset] += temp_val * r_val;
                        state_cur[h_2d_i_j_offset] = prev_state_val * time_decay_val + kv_val;
                    }
                }
            }
        }

    #else
        // basically fused operations:
        // dst = r @ (time_faaaa * (k @ v) + state),
        // state = time_decay * state + (k @ v),
        // recursive through each token
        for (int64_t t = 0; t < T; t++) {
            size_t t_offset = t * t_stride;
            size_t state_offset = head_size * C * (t / (T / n_seqs));
            float * state_cur = state + state_offset;
            float * state_prev = t % (T / n_seqs) ? state_cur : (float*)dst->src[5]->data + state_offset;

            for (int64_t h = h_start; h < h_end; h++) {
                size_t h_offset = h * h_stride;
                size_t t_h_offset = t_offset + h_offset;
                size_t h_2d_offset = h * h_stride_2d;

                for (int64_t i = 0; i < head_size; i++) {
                    size_t t_h_i_offset = t_h_offset + i;
                    size_t h_i_offset = h_offset + i;
                    size_t h_2d_i_offset = h_2d_offset + i * h_stride;

                    float k_val = k[t_h_i_offset];
                    float r_val = r[t_h_i_offset];
                    float time_faaaa_val = time_faaaa[h_i_offset];
                    // RWKV v6: different time_decay for each token.
                    float time_decay_val = time_decay[t_h_i_offset];

                    for (int64_t j = 0; j < head_size; j++) {
                        size_t t_h_j_offset = t_h_offset + j;
                        size_t h_2d_i_j_offset = h_2d_i_offset + j;

                        float v_val = v[t_h_j_offset];
                        float kv_val = v_val * k_val;
                        float prev_state_val = state_prev[h_2d_i_j_offset];
                        float temp_val = kv_val * time_faaaa_val + prev_state_val;
                        dst_data[t_h_j_offset] += temp_val * r_val;
                        state_cur[h_2d_i_j_offset] = prev_state_val * time_decay_val + kv_val;
                    }
                }
            }
        }
    #endif
}